

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O1

QAbstractButton * __thiscall
QAbstractButtonPrivate::queryCheckedButton(QAbstractButtonPrivate *this)

{
  long lVar1;
  long lVar2;
  QAbstractButtonPrivate *pQVar3;
  QAbstractButtonPrivate *pQVar4;
  undefined1 *puVar5;
  QAbstractButtonPrivate *pQVar6;
  undefined1 *puVar7;
  long in_FS_OFFSET;
  bool bVar8;
  QList<QAbstractButton_*> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->group == (QButtonGroup *)0x0) {
    pQVar3 = *(QAbstractButtonPrivate **)&(this->super_QWidgetPrivate).field_0x8;
    local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d.ptr = (QAbstractButton **)&DAT_aaaaaaaaaaaaaaaa;
    queryButtonList(&local_38,this);
    if (((this->field_0x28c & 8) == 0) || ((undefined1 *)local_38.d.size == (undefined1 *)0x1)) {
      pQVar6 = (QAbstractButtonPrivate *)0x0;
    }
    else {
      bVar8 = (undefined1 *)local_38.d.size != (undefined1 *)0x0;
      pQVar6 = this;
      if ((bVar8) &&
         ((pQVar4 = (QAbstractButtonPrivate *)*local_38.d.ptr, pQVar4 == pQVar3 ||
          (pQVar6 = pQVar4,
          (*(byte *)(*(long *)&(pQVar4->super_QWidgetPrivate).field_0x8 + 0x28c) & 2) == 0)))) {
        puVar5 = (undefined1 *)0x1;
        do {
          puVar7 = puVar5;
          pQVar6 = pQVar4;
          if ((undefined1 *)local_38.d.size == puVar7) break;
          pQVar6 = (QAbstractButtonPrivate *)local_38.d.ptr[(long)puVar7];
          puVar5 = puVar7 + 1;
        } while (pQVar6 == pQVar3 ||
                 (*(byte *)(*(long *)&(pQVar6->super_QWidgetPrivate).field_0x8 + 0x28c) & 2) == 0);
        bVar8 = puVar7 < (ulong)local_38.d.size;
      }
      if ((!bVar8) && (pQVar6 = pQVar3, (this->field_0x28c & 2) == 0)) {
        pQVar6 = (QAbstractButtonPrivate *)0x0;
      }
    }
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,8,0x10);
      }
    }
  }
  else {
    lVar1 = *(long *)&this->group->field_0x8;
    lVar2 = *(long *)(lVar1 + 0x90);
    if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
      pQVar6 = (QAbstractButtonPrivate *)0x0;
    }
    else {
      pQVar6 = *(QAbstractButtonPrivate **)(lVar1 + 0x98);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QAbstractButton *)pQVar6;
  }
  __stack_chk_fail();
}

Assistant:

QAbstractButton *QAbstractButtonPrivate::queryCheckedButton() const
{
#if QT_CONFIG(buttongroup)
    if (group)
        return group->d_func()->checkedButton;
#endif

    Q_Q(const QAbstractButton);
    QList<QAbstractButton *> buttonList = queryButtonList();
    if (!autoExclusive || buttonList.size() == 1) // no group
        return nullptr;

    for (int i = 0; i < buttonList.size(); ++i) {
        QAbstractButton *b = buttonList.at(i);
        if (b->d_func()->checked && b != q)
            return b;
    }
    return checked  ? const_cast<QAbstractButton *>(q) : nullptr;
}